

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O3

void __thiscall vw_ostream::vw_ostream(vw_ostream *this,void **vtt)

{
  _func_int **pp_Var1;
  
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ostream)._vptr_basic_ostream = pp_Var1;
  *(void **)((long)&(this->super_ostream)._vptr_basic_ostream + (long)pp_Var1[-3]) = vtt[3];
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_ostream)._vptr_basic_ostream = pp_Var1;
  *(void **)((long)&(this->super_ostream)._vptr_basic_ostream + (long)pp_Var1[-3]) = vtt[2];
  std::ios::init((streambuf *)
                 ((long)&(this->super_ostream)._vptr_basic_ostream +
                 (long)(this->super_ostream)._vptr_basic_ostream[-3]));
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ostream)._vptr_basic_ostream = pp_Var1;
  *(void **)((long)&(this->super_ostream)._vptr_basic_ostream + (long)pp_Var1[-3]) = vtt[3];
  *(code **)&(this->super_ostream).field_0x8 = boost::program_options::detail::cmdline::cmdline;
  *(undefined8 *)&(this->super_ostream).field_0x10 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x18 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x20 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x28 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x30 = 0;
  *(undefined8 *)&(this->super_ostream).field_0x38 = 0;
  std::locale::locale((locale *)&(this->super_ostream).field_0x40);
  *(undefined4 *)&(this->super_ostream).field_0x48 = 0x18;
  *(undefined1 **)&(this->super_ostream).field_0x50 = &(this->super_ostream).field_0x60;
  *(undefined8 *)&(this->super_ostream).field_0x58 = 0;
  (this->super_ostream).field_0x60 = 0;
  *(undefined ***)&(this->super_ostream).field_0x8 = &PTR__stringbuf_002eae78;
  *(vw_ostream **)&(this->super_ostream).field_0x70 = this;
  *(undefined8 *)&(this->super_ostream).field_0x78 = 0;
  *(code **)&(this->super_ostream).field_0x80 = trace_listener_cerr;
  return;
}

Assistant:

vw_ostream::vw_ostream() : std::ostream(&buf), buf(*this), trace_context(nullptr)
{
  trace_listener = trace_listener_cerr;
}